

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::HugeintToDecimalCast<short>
          (duckdb *this,hugeint_t input,short *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  short sVar2;
  long lVar3;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar4;
  uint uVar5;
  hugeint_t input_00;
  string error;
  hugeint_t max_width;
  allocator local_a9;
  hugeint_t local_a8;
  hugeint_t local_98;
  hugeint_t local_78;
  string local_68;
  string local_48 [32];
  
  uVar4 = CONCAT31(in_register_00000089,width);
  local_a8.upper = input.lower;
  lVar3 = (((ulong)parameters & 0xffffffff) - (ulong)uVar4) * 0x10;
  local_78.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar3);
  local_78.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar3 + 8);
  uVar5 = uVar4;
  local_a8.lower = (uint64_t)this;
  bVar1 = hugeint_t::operator>=(&local_a8,&local_78);
  params_2 = (uchar)uVar5;
  if (!bVar1) {
    local_98 = hugeint_t::operator-(&local_78);
    bVar1 = hugeint_t::operator<=(&local_a8,&local_98);
    if (!bVar1) {
      input_00 = hugeint_t::operator*
                           (&local_a8,(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uVar4 << 4)));
      sVar2 = Hugeint::Cast<short>(input_00);
      *(short *)input.upper = sVar2;
      return true;
    }
  }
  ::std::__cxx11::string::string(local_48,"Could not cast value %s to DECIMAL(%d,%d)",&local_a9);
  hugeint_t::ToString_abi_cxx11_(&local_68,&local_a8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            ((string *)&local_98,(StringUtil *)local_48,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)parameters & 0xff),width,params_2);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string(local_48);
  HandleCastError::AssignError((string *)&local_98,(CastParameters *)result);
  ::std::__cxx11::string::~string((string *)&local_98);
  return false;
}

Assistant:

bool HugeintToDecimalCast(hugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width || input <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Hugeint::Cast<DST>(input * Hugeint::POWERS_OF_TEN[scale]);
	return true;
}